

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen9Texture.cpp
# Opt level: O0

void __thiscall
GmmLib::GmmGen9TextureCalc::Fill2DTexOffsetAddress
          (GmmGen9TextureCalc *this,GMM_TEXTURE_INFO *pTexInfo)

{
  uint8_t uVar1;
  int iVar2;
  SKU_FEATURE_TABLE *pSVar3;
  undefined4 extraout_var;
  GMM_GFX_SIZE_T GVar4;
  uint32_t local_4c;
  uint32_t local_3c;
  uint local_38;
  uint32_t CompressDepth;
  uint32_t CompressHeight;
  uint32_t CompressWidth;
  uint32_t Alignment;
  uint32_t ArrayQPitch;
  GMM_PLATFORM_INFO *pPlatform;
  GMM_TEXTURE_INFO *pGStack_18;
  uint32_t i;
  GMM_TEXTURE_INFO *pTexInfo_local;
  GmmGen9TextureCalc *this_local;
  
  pGStack_18 = pTexInfo;
  pTexInfo_local = (GMM_TEXTURE_INFO *)this;
  _Alignment = GmmGetPlatformInfo((this->super_GmmTextureCalc).pGmmLibContext);
  if ((((pGStack_18->ArraySize < 2) && (pGStack_18->Type != RESOURCE_3D)) &&
      (pGStack_18->Type != RESOURCE_CUBE)) &&
     ((((ulong)(pGStack_18->Flags).Gpu >> 3 & 1) == 0 &&
      (((ulong)(pGStack_18->Flags).Gpu >> 4 & 1) == 0)))) {
    (pGStack_18->OffsetInfo).field_0.Texture3DOffsetInfo.Mip0SlicePitch = 0;
    (pGStack_18->OffsetInfo).field_0.Texture3DOffsetInfo.Offset[0] = 0;
  }
  else {
    CompressHeight = (pGStack_18->Alignment).VAlign;
    if ((((pGStack_18->Type == RESOURCE_3D) && (((ulong)(pGStack_18->Flags).Info >> 0x13 & 1) == 0))
        || (((((ulong)(pGStack_18->Flags).Gpu >> 0x19 & 1) != 0 &&
             (pSVar3 = Context::GetSkuTable((this->super_GmmTextureCalc).pGmmLibContext),
             (*(byte *)&pSVar3->field_5 >> 1 & 1) != 0)) ||
            ((*(ushort *)&(pGStack_18->Flags).Wa >> 0xb & 1) != 0)))) &&
       ((CompressHeight = _Alignment->TileInfo[pGStack_18->TileMode].LogicalTileHeight,
        ((ulong)(pGStack_18->Flags).Gpu >> 0x1d & 1) != 0 &&
        (((ulong)(pGStack_18->Flags).Info >> 0x22 & 1) != 0)))) {
      CompressHeight = CompressHeight << 1;
    }
    local_4c = Get2DMipMapTotalHeight(this,pGStack_18);
    if (CompressHeight != 0) {
      local_4c = local_4c +
                 ((CompressHeight - 1) - (local_4c + (CompressHeight - 1)) % CompressHeight);
    }
    CompressWidth = local_4c;
    if (((((ulong)(pGStack_18->Flags).Info >> 0x26 & 1) != 0) ||
        (((ulong)(pGStack_18->Flags).Info >> 0x2c & 1) != 0)) &&
       (pSVar3 = Context::GetSkuTable((this->super_GmmTextureCalc).pGmmLibContext),
       (*(ushort *)&pSVar3->field_0 >> 6 & 1) == 0)) {
      Context::GetSkuTable((this->super_GmmTextureCalc).pGmmLibContext);
    }
    (pGStack_18->Alignment).QPitch = CompressWidth;
    uVar1 = GmmIsCompressed((this->super_GmmTextureCalc).pGmmLibContext,pGStack_18->Format);
    if (uVar1 == '\0') {
      if ((((ulong)(pGStack_18->Flags).Gpu >> 0x1d & 1) == 0) ||
         (((ulong)(pGStack_18->Flags).Info >> 0x22 & 1) == 0)) {
        if ((((ulong)(pGStack_18->Flags).Gpu >> 1 & 1) != 0) &&
           (((ulong)(pGStack_18->Flags).Gpu >> 0x29 & 1) != 0)) {
          CompressWidth = CompressWidth >> 4;
        }
      }
      else {
        CompressWidth = CompressWidth >> 1;
        if ((pGStack_18->Type == RESOURCE_3D) &&
           (((ulong)(pGStack_18->Flags).Info >> 0x13 & 1) == 0)) {
          (pGStack_18->Alignment).QPitch = CompressWidth;
        }
      }
    }
    else {
      GmmTextureCalc::GetCompressionBlockDimensions
                (&this->super_GmmTextureCalc,pGStack_18->Format,&CompressDepth,&local_38,&local_3c);
      CompressWidth = CompressWidth / local_38;
      if ((pGStack_18->Type == RESOURCE_3D) && (((ulong)(pGStack_18->Flags).Info >> 0x13 & 1) == 0))
      {
        CompressWidth =
             (CompressWidth + (_Alignment->TileInfo[pGStack_18->TileMode].LogicalTileHeight - 1)) -
             (CompressWidth + (_Alignment->TileInfo[pGStack_18->TileMode].LogicalTileHeight - 1) &
             _Alignment->TileInfo[pGStack_18->TileMode].LogicalTileHeight - 1);
      }
    }
    GVar4 = (ulong)CompressWidth * pGStack_18->Pitch;
    (pGStack_18->OffsetInfo).field_0.Texture3DOffsetInfo.Mip0SlicePitch = GVar4;
    (pGStack_18->OffsetInfo).field_0.Texture3DOffsetInfo.Offset[0] = GVar4;
  }
  for (pPlatform._4_4_ = 0; pPlatform._4_4_ <= pGStack_18->MaxLod;
      pPlatform._4_4_ = pPlatform._4_4_ + 1) {
    iVar2 = (*(this->super_GmmTextureCalc)._vptr_GmmTextureCalc[8])
                      (this,pGStack_18,(ulong)pPlatform._4_4_);
    *(ulong *)(pGStack_18->MmcHint + (ulong)pPlatform._4_4_ * 8 + 0x80) =
         CONCAT44(extraout_var,iVar2);
  }
  return;
}

Assistant:

void GmmLib::GmmGen9TextureCalc::Fill2DTexOffsetAddress(GMM_TEXTURE_INFO *pTexInfo)
{
    uint32_t i;
    GMM_DPF_ENTER;

    const GMM_PLATFORM_INFO *pPlatform = GMM_OVERRIDE_PLATFORM_INFO(pTexInfo, pGmmLibContext);

    // QPitch: Array Element-to-Element, or Cube Face-to-Face Pitch...
    if((pTexInfo->ArraySize <= 1) &&
       (pTexInfo->Type != RESOURCE_3D) &&
       (pTexInfo->Type != RESOURCE_CUBE) &&
       !(pTexInfo->Flags.Gpu.ColorSeparation ||
         pTexInfo->Flags.Gpu.ColorSeparationRGBX))
    {
        pTexInfo->OffsetInfo.Texture2DOffsetInfo.ArrayQPitchRender =
        pTexInfo->OffsetInfo.Texture2DOffsetInfo.ArrayQPitchLock = 0;
    }
    else
    {
        uint32_t ArrayQPitch, Alignment;

        Alignment = pTexInfo->Alignment.VAlign;
        if((pTexInfo->Type == RESOURCE_3D && !pTexInfo->Flags.Info.Linear) ||
           (pTexInfo->Flags.Gpu.S3dDx && pGmmLibContext->GetSkuTable().FtrDisplayEngineS3d) ||
	   (pTexInfo->Flags.Wa.MediaPipeUsage))
         {
            Alignment = pPlatform->TileInfo[pTexInfo->TileMode].LogicalTileHeight;
	    //Gmm uses TileY for Stencil allocations, having half TileW height (TileY width compensates)
            if(pTexInfo->Flags.Gpu.SeparateStencil && pTexInfo->Flags.Info.TiledW)
            {
                Alignment *= 2;
            }
	}

        // Calculate the overall Block height...Mip0Height + Max(Mip1Height, Sum of Mip2Height..MipnHeight)
        ArrayQPitch = Get2DMipMapTotalHeight(pTexInfo);
        ArrayQPitch = GFX_ALIGN_NP2(ArrayQPitch, Alignment);
	    
	// Color Surf with MSAA Enabled Mutiply 4
        if (GMM_IS_64KB_TILE(pTexInfo->Flags) && (!pGmmLibContext->GetSkuTable().FtrTileY) && (!pGmmLibContext->GetSkuTable().FtrXe2PlusTiling) &&
           ((pTexInfo->MSAA.NumSamples == 8) || (pTexInfo->MSAA.NumSamples == 16)) &&
           ((pTexInfo->Flags.Gpu.Depth == 0) && (pTexInfo->Flags.Gpu.SeparateStencil == 0)))
        {
           // ArrayQPitch *= 4; /* Aligned height of 4 samples */
        }
	    
        pTexInfo->Alignment.QPitch = ArrayQPitch;

        if(GmmIsCompressed(pGmmLibContext, pTexInfo->Format))
        {
            uint32_t CompressWidth, CompressHeight, CompressDepth;

            GetCompressionBlockDimensions(pTexInfo->Format, &CompressWidth, &CompressHeight, &CompressDepth);

            ArrayQPitch /= CompressHeight;

            if((pTexInfo->Type == RESOURCE_3D) && !pTexInfo->Flags.Info.Linear)
            {
                ArrayQPitch = GFX_ALIGN(ArrayQPitch, pPlatform->TileInfo[pTexInfo->TileMode].LogicalTileHeight);
            }
        }
        else if(pTexInfo->Flags.Gpu.SeparateStencil && pTexInfo->Flags.Info.TiledW)
        {
            ArrayQPitch /= 2;
	    if(pTexInfo->Type == RESOURCE_3D && !pTexInfo->Flags.Info.Linear)
            {
                pTexInfo->Alignment.QPitch = ArrayQPitch;
            }
        }
        else if(pTexInfo->Flags.Gpu.CCS && pTexInfo->Flags.Gpu.__NonMsaaTileYCcs)
        {
            ArrayQPitch /= 16;
        }

        pTexInfo->OffsetInfo.Texture2DOffsetInfo.ArrayQPitchRender =
        pTexInfo->OffsetInfo.Texture2DOffsetInfo.ArrayQPitchLock = ArrayQPitch * pTexInfo->Pitch;
    }

    for(i = 0; i <= pTexInfo->MaxLod; i++)
    {
        pTexInfo->OffsetInfo.Texture2DOffsetInfo.Offset[i] = Get2DTexOffsetAddressPerMip(pTexInfo, i);
    }

    GMM_DPF_EXIT;
}